

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

void __thiscall
Gudhi::ripser::
Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>>
::
add_coboundary<Gudhi::ripser::Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t>>,Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t>>>
          (Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>>
           *this,Compressed_sparse_matrix *reduction_matrix,
          vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
          *columns_to_reduce,size_t index_column_to_add,coefficient_t factor,dimension_t dim,
          Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>
          *working_reduction_column,
          Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>
          *working_coboundary)

{
  pointer pdVar1;
  diameter_entry_t simplex_00;
  diameter_entry_t simplex_01;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  __normal_iterator<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>_>
  _Var5;
  iterator_pair iVar6;
  diameter_entry_t simplex;
  entry_plain_t local_68;
  value_t local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pdVar1 = (columns_to_reduce->
           super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = pdVar1[index_column_to_add].diameter;
  uStack_40 = *(undefined8 *)((long)&pdVar1[index_column_to_add].index + 8);
  local_48 = (undefined8)pdVar1[index_column_to_add].index;
  simplex_00.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
  ._4_4_ = uStack_54;
  simplex_00.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
  .first = local_58;
  simplex_00.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
  ._8_8_ = uStack_50;
  simplex_00.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
  .second.index._0_8_ = local_48;
  simplex_00.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
  .second.index._8_8_ = uStack_40;
  add_simplex_coboundary<Gudhi::ripser::Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t>>,Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t>>>
            (this,simplex_00,dim,working_reduction_column,working_coboundary);
  iVar6 = Compressed_sparse_matrix_<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
          ::subrange(reduction_matrix,index_column_to_add);
  for (_Var5._M_current =
            iVar6.
            super_iterator_range_base<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>_>,_boost::iterators::random_access_traversal_tag>
            .
            super_iterator_range_base<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>_>,_boost::iterators::bidirectional_traversal_tag>
            .
            super_iterator_range_base<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>_>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin._M_current;
      _Var5._M_current !=
      iVar6.
      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_current; _Var5._M_current = _Var5._M_current + 1) {
    uVar2 = ((_Var5._M_current)->
            super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
            ).first;
    uVar3 = *(undefined8 *)
             &((_Var5._M_current)->
              super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
              ).field_0x4;
    uVar4 = *(undefined4 *)
             &((_Var5._M_current)->
              super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
              ).field_0xc;
    simplex_01.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
    ._12_4_ = uVar4;
    simplex_01.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
    ._4_8_ = uVar3;
    simplex_01.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
    .first = (float)uVar2;
    local_68.index._0_8_ =
         (undefined8)
         ((_Var5._M_current)->
         super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
         ).second.index;
    local_68.index._8_8_ =
         *(undefined8 *)
          ((long)&((_Var5._M_current)->
                  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
                  ).second.index + 8);
    Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
    ::set_coefficient(&local_68,factor % *(uint *)(this + 0x70));
    simplex_01.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
    .second.index._0_8_ = (undefined8)local_68.index;
    simplex_01.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
    .second.index._8_8_ = local_68.index._8_8_;
    add_simplex_coboundary<Gudhi::ripser::Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t>>,Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_entry_t>>>
              (this,simplex_01,dim,working_reduction_column,working_coboundary);
  }
  return;
}

Assistant:

void add_coboundary(Compressed_sparse_matrix& reduction_matrix,
        const std::vector<diameter_simplex_t>& columns_to_reduce,
        const size_t index_column_to_add, const coefficient_t factor,
        const dimension_t dim, Column& working_reduction_column,
        Column& working_coboundary) {
      diameter_entry_t column_to_add = filt.make_diameter_entry(columns_to_reduce[index_column_to_add], factor);
      add_simplex_coboundary(column_to_add, dim, working_reduction_column, working_coboundary);

      for (diameter_entry_t simplex : reduction_matrix.subrange(index_column_to_add)) {
        filt.set_coefficient(simplex, filt.get_coefficient(simplex) * factor % modulus);
        add_simplex_coboundary(simplex, dim, working_reduction_column, working_coboundary);
      }
    }